

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O2

int runseasonalitytests(double *x,int N,int f,char *test)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double local_48;
  double local_40;
  double stat;
  int f_local;
  
  stat._4_4_ = f;
  iVar1 = strcmp(test,"ocsb");
  if (iVar1 == 0) {
    OCSBtest(x,N,f,3,"aic",&local_40,&local_48);
    bVar3 = local_40 == local_48;
    bVar2 = local_40 < local_48;
  }
  else {
    iVar1 = strcmp(test,"seas");
    if (iVar1 != 0) {
      return iVar1;
    }
    SHtest(x,N,(int *)((long)&stat + 4),1,&local_40);
    bVar3 = local_40 == 0.64;
    bVar2 = local_40 < 0.64;
  }
  return (uint)(!bVar2 && !bVar3);
}

Assistant:

static int runseasonalitytests(double *x, int N,int f, const char * test) {
    int diff,mlags;
    double stat,crit;
    const char *method;

    if (!strcmp(test,"ocsb")) {
        mlags = 3;
        method = "aic";
        OCSBtest(x,N,f,mlags,method,&stat,&crit);
        diff = (stat > crit) ? 1 : 0;
    } else if (!strcmp(test,"seas")) {
        crit = 0.64;
        SHtest(x,N,&f,1,&stat);
        diff = (stat > crit) ? 1 : 0;
    }

    return diff;
}